

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

AMQP_VALUE amqpvalue_create_disposition(DISPOSITION_HANDLE disposition)

{
  AMQP_VALUE pAVar1;
  
  if (disposition != (DISPOSITION_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(disposition->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_disposition(DISPOSITION_HANDLE disposition)
{
    AMQP_VALUE result;

    if (disposition == NULL)
    {
        result = NULL;
    }
    else
    {
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        result = amqpvalue_clone(disposition_instance->composite_value);
    }

    return result;
}